

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_geom.c
# Opt level: O2

REF_STATUS ref_geom_curve_tec(REF_GRID ref_grid,char *filename)

{
  REF_GEOM pRVar1;
  REF_INT *pRVar2;
  REF_CELL pRVar3;
  REF_DBL *pRVar4;
  uint uVar5;
  REF_STATUS RVar6;
  FILE *__s;
  ulong uVar7;
  ulong uVar8;
  undefined8 uVar9;
  int iVar10;
  uint uVar11;
  char *pcVar12;
  long lVar13;
  REF_INT geom;
  long lVar14;
  int iVar15;
  REF_DICT ref_dict;
  FILE *local_128;
  REF_DBL ks;
  REF_DBL kr;
  uint local_10c;
  uint local_108;
  REF_INT local;
  REF_GRID local_100;
  REF_DBL local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  REF_DBL local_d8 [4];
  REF_CELL local_b8;
  REF_NODE local_b0;
  REF_INT nodes [27];
  
  pRVar1 = ref_grid->geom;
  local_100 = ref_grid;
  __s = fopen(filename,"w");
  if (__s == (FILE *)0x0) {
    printf("unable to open %s\n",filename);
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",0xe35,
           "ref_geom_curve_tec","unable to open file");
    RVar6 = 2;
  }
  else {
    fwrite("title=\"refine cad coupling in tecplot format\"\n",0x2e,1,__s);
    fwrite("variables = \"x\" \"y\" \"z\" \"kr\" \"rx\" \"ry\" \"rz\" \"ks\" \"sx\" \"sy\" \"sz\"\n"
           ,0x40,1,__s);
    uVar11 = pRVar1->max;
    uVar7 = 0;
    uVar8 = (ulong)uVar11;
    if ((int)uVar11 < 1) {
      uVar8 = uVar7;
    }
    local_10c = 0x80000000;
    uVar11 = 0x7fffffff;
    for (; local_128 = __s, uVar8 * 0x18 - uVar7 != 0; uVar7 = uVar7 + 0x18) {
      pRVar2 = pRVar1->descr;
      if (*(int *)((long)pRVar2 + uVar7) == 2) {
        uVar5 = *(uint *)((long)pRVar2 + uVar7 + 4);
        if ((int)uVar5 <= (int)uVar11) {
          uVar11 = uVar5;
        }
        if ((int)local_10c <= (int)uVar5) {
          local_10c = uVar5;
        }
      }
    }
    for (; (int)uVar11 <= (int)local_10c; uVar11 = uVar11 + 1) {
      local_b0 = local_100->node;
      pRVar3 = local_100->cell[3];
      pRVar1 = local_100->geom;
      kr = 0.0;
      local_e8 = 0;
      local_f8 = 0.0;
      uStack_f0 = 0;
      ks = 0.0;
      local_d8[0] = 0.0;
      local_d8[1] = 0.0;
      local_d8[2] = 0.0;
      uVar5 = ref_dict_create(&ref_dict);
      if (uVar5 != 0) {
        uVar8 = (ulong)uVar5;
        pcVar12 = "create dict";
        uVar9 = 0xdb4;
LAB_0019228f:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               uVar9,"ref_geom_curve_tec_zone",uVar8,pcVar12);
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_geom.c",
               0xe44,"ref_geom_curve_tec",uVar8,"tec face");
        return (REF_STATUS)uVar8;
      }
      lVar13 = 0;
      for (lVar14 = 0; __s = local_128, lVar14 < pRVar1->max; lVar14 = lVar14 + 1) {
        pRVar2 = pRVar1->descr;
        if (((*(int *)((long)pRVar2 + lVar13) == 2) &&
            (*(uint *)((long)pRVar2 + lVar13 + 4) == uVar11)) &&
           (uVar5 = ref_dict_store(ref_dict,*(REF_INT *)((long)pRVar2 + lVar13 + 0x14),
                                   (REF_INT)lVar14), uVar5 != 0)) {
          uVar8 = (ulong)uVar5;
          pcVar12 = "mark nodes";
          uVar9 = 0xdb9;
          goto LAB_0019228f;
        }
        lVar13 = lVar13 + 0x18;
      }
      local_108 = ref_dict->n;
      uVar8 = 0;
      for (iVar10 = 0; iVar10 < pRVar3->max; iVar10 = iVar10 + 1) {
        RVar6 = ref_cell_nodes(pRVar3,iVar10,nodes);
        uVar8 = (ulong)((int)uVar8 + (uint)(nodes[3] == uVar11 && RVar6 == 0));
      }
      if ((local_108 == 0) || ((int)uVar8 == 0)) {
        uVar5 = ref_dict_free(ref_dict);
        if (uVar5 != 0) {
          uVar8 = (ulong)uVar5;
          pcVar12 = "free dict";
          uVar9 = 0xdc7;
          goto LAB_0019228f;
        }
      }
      else {
        local_b8 = pRVar3;
        fprintf(__s,"zone t=\"curve%d\", nodes=%d, elements=%d, datapacking=%s, zonetype=%s\n",
                (ulong)uVar11,(ulong)local_108,uVar8,"point","fetriangle");
        iVar10 = ref_dict->n;
        geom = -1;
        iVar15 = -1;
        if (0 < iVar10) {
          iVar15 = *ref_dict->key;
          geom = *ref_dict->value;
        }
        for (lVar13 = 1; pRVar3 = local_b8, __s = local_128, lVar13 + -1 < (long)iVar10;
            lVar13 = lVar13 + 1) {
          if ((pRVar1->model != (void *)0x0) &&
             (uVar5 = ref_egads_face_curvature(pRVar1,geom,&kr,&local_f8,&ks,local_d8), uVar5 != 0))
          {
            uVar8 = (ulong)uVar5;
            pcVar12 = "curve";
            uVar9 = 0xdd2;
            goto LAB_0019228f;
          }
          if ((pRVar1->meshlink != (void *)0x0) &&
             (uVar5 = ref_meshlink_face_curvature(local_100,geom,&kr,&local_f8,&ks,local_d8),
             uVar5 != 0)) {
            uVar8 = (ulong)uVar5;
            pcVar12 = "curve";
            uVar9 = 0xdd5;
            goto LAB_0019228f;
          }
          pRVar4 = local_b0->real;
          lVar14 = (long)(iVar15 * 0xf);
          fprintf(local_128," %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e %.16e\n",
                  SUB84(pRVar4[lVar14],0),pRVar4[lVar14 + 1],pRVar4[lVar14 + 2],kr,local_f8,
                  uStack_f0,local_e8,ks);
          iVar10 = ref_dict->n;
          geom = -1;
          iVar15 = -1;
          if ((int)lVar13 < iVar10) {
            iVar15 = ref_dict->key[lVar13];
            geom = ref_dict->value[lVar13];
          }
        }
        for (iVar10 = 0; iVar10 < pRVar3->max; iVar10 = iVar10 + 1) {
          RVar6 = ref_cell_nodes(pRVar3,iVar10,nodes);
          if ((RVar6 == 0) && (nodes[3] == uVar11)) {
            for (lVar13 = 0; lVar13 != 3; lVar13 = lVar13 + 1) {
              uVar5 = ref_dict_location(ref_dict,nodes[lVar13],&local);
              if (uVar5 != 0) {
                uVar8 = (ulong)uVar5;
                pcVar12 = "localize";
                uVar9 = 0xde2;
                goto LAB_0019228f;
              }
              fprintf(__s," %d",(ulong)(local + 1));
            }
            fputc(10,__s);
          }
        }
        uVar5 = ref_dict_free(ref_dict);
        if (uVar5 != 0) {
          uVar8 = (ulong)uVar5;
          pcVar12 = "free dict";
          uVar9 = 0xde9;
          goto LAB_0019228f;
        }
      }
    }
    fclose(__s);
    RVar6 = 0;
  }
  return RVar6;
}

Assistant:

REF_FCN REF_STATUS ref_geom_curve_tec(REF_GRID ref_grid, const char *filename) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  FILE *file;
  REF_INT geom, id, min_id, max_id;

  file = fopen(filename, "w");
  if (NULL == (void *)file) printf("unable to open %s\n", filename);
  RNS(file, "unable to open file");

  fprintf(file, "title=\"refine cad coupling in tecplot format\"\n");
  fprintf(file,
          "variables = \"x\" \"y\" \"z\" \"kr\" \"rx\" \"ry\" \"rz\" "
          "\"ks\" \"sx\" \"sy\" \"sz\"\n");

  min_id = REF_INT_MAX;
  max_id = REF_INT_MIN;
  each_ref_geom_face(ref_geom, geom) {
    min_id = MIN(min_id, ref_geom_id(ref_geom, geom));
    max_id = MAX(max_id, ref_geom_id(ref_geom, geom));
  }

  for (id = min_id; id <= max_id; id++)
    RSS(ref_geom_curve_tec_zone(ref_grid, id, file), "tec face");

  fclose(file);
  return REF_SUCCESS;
}